

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O3

uint64_t find_max_batch(vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,
                       uint32_t trigram,uint64_t max_bytes)

{
  pointer puVar1;
  pointer pIVar2;
  pointer pIVar3;
  long lVar4;
  ulong uVar5;
  IndexMergeHelper *ndx;
  pointer pIVar6;
  
  if (0xfeffffff < trigram - 0xffffff) {
    pIVar2 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pIVar3 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar4 = 1;
    do {
      if (pIVar2 != pIVar3) {
        uVar5 = 0;
        pIVar6 = pIVar2;
        do {
          puVar1 = (pIVar6->run_offset_cache).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + trigram;
          uVar5 = (uVar5 - *puVar1) + puVar1[lVar4];
          pIVar6 = pIVar6 + 1;
        } while (pIVar6 != pIVar3);
        if (max_bytes < uVar5) {
          return (long)((int)lVar4 + -1);
        }
      }
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 + trigram < 0x1000000);
  }
  return (ulong)(0x1000000 - trigram);
}

Assistant:

uint64_t find_max_batch(const std::vector<IndexMergeHelper> &indexes,
                        uint32_t trigram, uint64_t max_bytes) {
    for (int i = 1; trigram + i < NUM_TRIGRAMS; i++) {
        uint64_t batch_bytes = 0;
        for (const auto &ndx : indexes) {
            batch_bytes += ndx.run(trigram, i).size();
        }
        if (batch_bytes > max_bytes) {
            return i - 1;
        }
    }
    return NUM_TRIGRAMS - trigram;
}